

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderRenderingTrianglesCase::GeometryShaderRenderingTrianglesCase
          (GeometryShaderRenderingTrianglesCase *this,Context *context,ExtParameters *extParams,
          char *name,bool use_adjacency_data,GLenum drawcall_mode,_shader_output_type output_type)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  TestError *pTVar8;
  float *pfVar9;
  uchar *puVar10;
  ulong uVar11;
  uchar uVar12;
  long lVar13;
  undefined7 in_register_00000081;
  _func_int **pp_Var14;
  float **ppfVar15;
  uint *puVar16;
  ulong uVar17;
  float **ppfVar18;
  uchar **ppuVar19;
  float fVar20;
  float fVar21;
  uint whole_rt_height;
  uint single_rt_height;
  uint rendertarget_width;
  uint rendertarget_height;
  uint whole_rt_width;
  uint single_rt_width;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_coordinates;
  float local_164;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  ulong local_148;
  uint *local_140;
  float local_138;
  float local_134;
  undefined4 local_130;
  undefined4 local_12c;
  Vector<float,_4> local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint *local_c0;
  void *local_b8;
  undefined8 uStack_b0;
  long local_a8;
  uint *local_98;
  uchar **local_90;
  uint *local_88;
  float **local_80;
  uint *local_78;
  float **local_70;
  uint *local_68;
  uchar **local_60;
  uint *local_58;
  float **local_50;
  uint *local_48;
  float **local_40;
  uint *local_38;
  
  TestCaseBase::TestCaseBase
            ((TestCaseBase *)this,context,extParams,name,
             "Verifies all draw calls work correctly for specific input+output+draw call mode combination"
            );
  (this->super_GeometryShaderRenderingCase).m_context = context;
  (this->super_GeometryShaderRenderingCase).m_instanced_raw_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_unordered_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_unordered_elements_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_noninstanced_raw_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_noninstanced_unordered_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_noninstanced_unordered_elements_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_fs_id = 0;
  (this->super_GeometryShaderRenderingCase).m_gs_id = 0;
  (this->super_GeometryShaderRenderingCase).m_po_id = 0;
  (this->super_GeometryShaderRenderingCase).m_renderingTargetSize_uniform_location = 0;
  (this->super_GeometryShaderRenderingCase).m_singleRenderingTargetSize_uniform_location = 0;
  (this->super_GeometryShaderRenderingCase).m_vao_id = 0;
  (this->super_GeometryShaderRenderingCase).m_vs_id = 0;
  (this->super_GeometryShaderRenderingCase).m_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_read_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_to_id = 0;
  (this->super_GeometryShaderRenderingCase).m_to_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_read_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_to_id = 0;
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingTrianglesCase_02106960;
  *(_shader_output_type *)&(this->super_GeometryShaderRenderingCase).field_0x304 = output_type;
  this->m_drawcall_mode = drawcall_mode;
  this->m_use_adjacency_data = use_adjacency_data;
  this->m_raw_array_instanced_data = (float *)0x0;
  this->m_raw_array_instanced_data_size = 0;
  this->m_raw_array_noninstanced_data = (float *)0x0;
  this->m_raw_array_noninstanced_data_size = 0;
  this->m_unordered_array_instanced_data = (float *)0x0;
  this->m_unordered_array_instanced_data_size = 0;
  this->m_unordered_array_noninstanced_data = (float *)0x0;
  this->m_unordered_array_noninstanced_data_size = 0;
  this->m_unordered_elements_instanced_data = (uchar *)0x0;
  this->m_unordered_elements_instanced_data_size = 0;
  this->m_unordered_elements_noninstanced_data = (uchar *)0x0;
  this->m_unordered_elements_noninstanced_data_size = 0;
  this->m_unordered_elements_max_index = '\x18';
  this->m_unordered_elements_min_index = '\0';
  if ((int)CONCAT71(in_register_00000081,use_adjacency_data) == 0) {
    if (drawcall_mode - 7 < 0xfffffffd) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,
                 "Only GL_TRIANGLES or GL_TRIANGLE_STRIP or GL_TRIANGLE_FAN draw call modes are supported for \'triangles\' geometry shader input layout qualifier test implementation"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xeeb);
      goto LAB_00d15d01;
    }
  }
  else if (drawcall_mode - 0xe < 0xfffffffe) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,
               "Only GL_TRIANGLES_ADJACENCY_EXT or GL_TRIANGLE_STRIP_ADJACENCY_EXT draw call modes are supported for \'triangles_adjacency\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xef3);
    goto LAB_00d15d01;
  }
  local_70 = &this->m_raw_array_instanced_data;
  local_78 = &this->m_raw_array_instanced_data_size;
  local_40 = &this->m_raw_array_noninstanced_data;
  local_48 = &this->m_raw_array_noninstanced_data_size;
  local_80 = &this->m_unordered_array_instanced_data;
  local_88 = &this->m_unordered_array_instanced_data_size;
  local_50 = &this->m_unordered_array_noninstanced_data;
  local_58 = &this->m_unordered_array_noninstanced_data_size;
  local_90 = &this->m_unordered_elements_instanced_data;
  local_98 = &this->m_unordered_elements_instanced_data_size;
  local_60 = &this->m_unordered_elements_noninstanced_data;
  local_68 = &this->m_unordered_elements_noninstanced_data_size;
  if (output_type < SHADER_OUTPUT_TYPE_COUNT) {
    local_164 = 0.0;
    if (output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
      local_164 = 1.5;
    }
    bVar5 = true;
    do {
      bVar4 = bVar5;
      local_14c = 0;
      local_150 = 0;
      pp_Var14 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                 super_TestNode._vptr_TestNode;
      if (bVar4) {
        uVar7 = 1;
        local_140 = local_48;
        local_c0 = local_58;
        ppfVar15 = local_40;
        puVar16 = local_68;
        ppfVar18 = local_50;
        ppuVar19 = local_60;
      }
      else {
        uVar7 = (*pp_Var14[5])(this);
        pp_Var14 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                   super_TestNode._vptr_TestNode;
        local_140 = local_78;
        local_c0 = local_88;
        ppfVar15 = local_70;
        puVar16 = local_98;
        ppfVar18 = local_80;
        ppuVar19 = local_90;
      }
      (*pp_Var14[0xd])(this,(ulong)uVar7,&local_150,&local_14c);
      uVar11 = (ulong)local_150;
      local_148 = (ulong)local_14c;
      local_154 = 0;
      local_12c = 0;
      local_130 = 0;
      local_158 = 0;
      iVar6 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[7])(this);
      *local_140 = iVar6 << 4;
      pfVar9 = (float *)operator_new__((ulong)(uint)(iVar6 << 4));
      *ppfVar15 = pfVar9;
      (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
        _vptr_TestNode[0xd])(this,1,&local_12c,&local_154);
      uVar7 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[5])(this);
      (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
        _vptr_TestNode[0xd])(this,(ulong)uVar7,&local_130,&local_158);
      local_b8 = (void *)0x0;
      uStack_b0 = 0;
      local_a8 = 0;
      fVar21 = 0.0;
      local_134 = 1.0;
      if (!bVar4) {
        local_134 = (float)local_154 / (float)local_158 + (float)local_154 / (float)local_158 + -1.0
        ;
        fVar21 = (local_134 + 1.0) * 0.5 + -1.0;
      }
      local_128.m_data._0_8_ = (ulong)(uint)fVar21 << 0x20;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 1.0;
      local_38 = puVar16;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_b8,
                 &local_128);
      local_138 = (2.0 / (float)uVar11) * local_164;
      local_128.m_data[1] = fVar21;
      local_128.m_data[0] = local_138 + -1.0;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_b8,
                 &local_128);
      fVar20 = (2.0 / (float)(long)local_148) * local_164;
      local_148 = CONCAT44(local_148._4_4_,fVar20);
      local_128.m_data._0_8_ = (ulong)(uint)(fVar20 + -1.0) << 0x20;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_b8,
                 &local_128);
      local_128.m_data[0] = 1.0 - local_138;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_b8,
                 &local_128);
      local_128.m_data._0_8_ = (ulong)(uint)(local_134 - (float)local_148) << 0x20;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_b8,
                 &local_128);
      pfVar9 = *ppfVar15;
      local_d8 = 0xffffffffffffffff;
      uStack_d0 = 0xffffffffffffffff;
      local_e8 = 0xffffffffffffffff;
      uStack_e0 = 0xffffffffffffffff;
      local_f8 = 0xffffffffffffffff;
      uStack_f0 = 0xffffffffffffffff;
      local_108 = 0xffffffffffffffff;
      uStack_100 = 0xffffffffffffffff;
      local_118 = 0xffffffffffffffff;
      uStack_110 = 0xffffffffffffffff;
      local_128.m_data[0] = -NAN;
      local_128.m_data[1] = -NAN;
      local_128.m_data[2] = -NAN;
      local_128.m_data[3] = -NAN;
      switch(this->m_drawcall_mode) {
      case 4:
        local_128.m_data[0] = 0.0;
        local_128.m_data[1] = 1.4013e-45;
        local_128.m_data[2] = 2.8026e-45;
        local_128.m_data[3] = 0.0;
        local_118 = 0x300000002;
        uStack_110 = 0x300000000;
        local_108 = 4;
        uStack_100 = 0x100000004;
        uVar7 = 0xc;
        break;
      case 5:
        local_128.m_data[0] = 1.4013e-45;
        local_128.m_data[1] = 0.0;
        local_128.m_data[2] = 2.8026e-45;
        local_128.m_data[3] = 4.2039e-45;
        local_118 = 0x400000000;
        uStack_110 = 0xffffffff00000001;
        uVar7 = 7;
        break;
      case 6:
        local_128.m_data[0] = 0.0;
        local_128.m_data[1] = 1.4013e-45;
        local_128.m_data[2] = 2.8026e-45;
        local_128.m_data[3] = 4.2039e-45;
        local_118 = 0x100000004;
        uVar7 = 6;
        break;
      default:
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Unsupported draw call mode",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xff2);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      case 0xc:
        local_128.m_data[0] = 0.0;
        local_128.m_data[1] = 0.0;
        local_128.m_data[2] = 1.4013e-45;
        local_128.m_data[3] = 0.0;
        local_118 = 2;
        uStack_110 = 0;
        local_108 = 2;
        uStack_100 = 3;
        local_f8 = 0;
        uStack_f0 = 3;
        local_e8 = 4;
        uStack_e0 = 0;
        local_d8 = 4;
        uStack_d0 = 1;
        uVar7 = 0x18;
        break;
      case 0xd:
        local_128.m_data[0] = 1.4013e-45;
        local_128.m_data[1] = 0.0;
        local_128.m_data[2] = 0.0;
        local_128.m_data[3] = 0.0;
        local_118 = 2;
        uStack_110 = 3;
        local_108 = 0;
        uStack_100 = 4;
        local_f8 = 1;
        uVar7 = 0xe;
      }
      uVar17 = (ulong)uVar7;
      uVar11 = 0;
      do {
        if ((long)(int)local_128.m_data[uVar11] != -1) {
          lVar13 = (long)(int)local_128.m_data[uVar11] * 0x10;
          *pfVar9 = *(float *)((long)local_b8 + lVar13);
          pfVar9[1] = *(float *)((long)local_b8 + lVar13 + 4);
          pfVar9[2] = *(float *)((long)local_b8 + lVar13 + 8);
          pfVar9[3] = *(float *)((long)local_b8 + lVar13 + 0xc);
          pfVar9 = pfVar9 + 4;
        }
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
      uVar2 = *local_140;
      *local_c0 = uVar2;
      pfVar9 = (float *)operator_new__((ulong)uVar2 << 2);
      *ppfVar18 = pfVar9;
      *local_38 = uVar7;
      puVar10 = (uchar *)operator_new__(uVar17);
      *ppuVar19 = puVar10;
      uVar11 = (ulong)(uVar7 << 4);
      lVar13 = 0;
      do {
        uVar3 = ((undefined8 *)((long)*ppfVar15 + lVar13))[1];
        puVar1 = (undefined8 *)((long)*ppfVar18 + (uVar11 - 0x10));
        *puVar1 = *(undefined8 *)((long)*ppfVar15 + lVar13);
        puVar1[1] = uVar3;
        lVar13 = lVar13 + 0x10;
        uVar11 = uVar11 - 0x10;
      } while (uVar11 != 0);
      uVar12 = (uchar)uVar7;
      uVar11 = 0;
      do {
        uVar12 = uVar12 + 0xff;
        (*ppuVar19)[uVar11] = uVar12;
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
      if (local_b8 != (void *)0x0) {
        operator_delete(local_b8,local_a8 - (long)local_b8);
      }
      bVar5 = false;
    } while (bVar4);
    return;
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,
             "Unsupported output layout qualifier type requested for \'triangles\' geometry shader input layout qualifier test implementation"
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0xefb);
LAB_00d15d01:
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GeometryShaderRenderingTrianglesCase::GeometryShaderRenderingTrianglesCase(Context&				context,
																		   const ExtParameters& extParams,
																		   const char* name, bool use_adjacency_data,
																		   glw::GLenum		   drawcall_mode,
																		   _shader_output_type output_type)
	: GeometryShaderRenderingCase(
		  context, extParams, name,
		  "Verifies all draw calls work correctly for specific input+output+draw call mode combination")
	, m_output_type(output_type)
	, m_drawcall_mode(drawcall_mode)
	, m_use_adjacency_data(use_adjacency_data)
	, m_raw_array_instanced_data(0)
	, m_raw_array_instanced_data_size(0)
	, m_raw_array_noninstanced_data(0)
	, m_raw_array_noninstanced_data_size(0)
	, m_unordered_array_instanced_data(0)
	, m_unordered_array_instanced_data_size(0)
	, m_unordered_array_noninstanced_data(0)
	, m_unordered_array_noninstanced_data_size(0)
	, m_unordered_elements_instanced_data(0)
	, m_unordered_elements_instanced_data_size(0)
	, m_unordered_elements_noninstanced_data(0)
	, m_unordered_elements_noninstanced_data_size(0)
	, m_unordered_elements_max_index(24) /* maximum amount of vertices generated by this test case */
	, m_unordered_elements_min_index(0)
{
	/* Sanity checks */
	if (!m_use_adjacency_data)
	{
		if (drawcall_mode != GL_TRIANGLES && drawcall_mode != GL_TRIANGLE_STRIP && drawcall_mode != GL_TRIANGLE_FAN)
		{
			TCU_FAIL("Only GL_TRIANGLES or GL_TRIANGLE_STRIP or GL_TRIANGLE_FAN draw call modes are supported for "
					 "'triangles' geometry shader input layout qualifier test implementation");
		}
	}
	else
	{
		if (drawcall_mode != GL_TRIANGLES_ADJACENCY_EXT && drawcall_mode != GL_TRIANGLE_STRIP_ADJACENCY_EXT)
		{
			TCU_FAIL("Only GL_TRIANGLES_ADJACENCY_EXT or GL_TRIANGLE_STRIP_ADJACENCY_EXT draw call modes are supported "
					 "for 'triangles_adjacency' geometry shader input layout qualifier test implementation");
		}
	}

	if (output_type != SHADER_OUTPUT_TYPE_POINTS && output_type != SHADER_OUTPUT_TYPE_LINE_STRIP &&
		output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP)
	{
		TCU_FAIL("Unsupported output layout qualifier type requested for 'triangles' geometry shader input layout "
				 "qualifier test implementation");
	}

	/* Generate data in two flavors - one for non-instanced case, the other one for instanced case */
	for (int n_case = 0; n_case < 2 /* cases */; ++n_case)
	{
		bool			is_instanced					 = (n_case != 0);
		int				n_instances						 = 0;
		float**			raw_arrays_data_ptr				 = NULL;
		unsigned int*   raw_arrays_data_size_ptr		 = NULL;
		unsigned int	rendertarget_height				 = 0;
		unsigned int	rendertarget_width				 = 0;
		float**			unordered_arrays_data_ptr		 = NULL;
		unsigned int*   unordered_arrays_data_size_ptr   = NULL;
		unsigned char** unordered_elements_data_ptr		 = NULL;
		unsigned int*   unordered_elements_data_size_ptr = NULL;

		if (!is_instanced)
		{
			/* Non-instanced case */
			n_instances						 = 1;
			raw_arrays_data_ptr				 = &m_raw_array_noninstanced_data;
			raw_arrays_data_size_ptr		 = &m_raw_array_noninstanced_data_size;
			unordered_arrays_data_ptr		 = &m_unordered_array_noninstanced_data;
			unordered_arrays_data_size_ptr   = &m_unordered_array_noninstanced_data_size;
			unordered_elements_data_ptr		 = &m_unordered_elements_noninstanced_data;
			unordered_elements_data_size_ptr = &m_unordered_elements_noninstanced_data_size;
		}
		else
		{
			/* Instanced case */
			n_instances						 = getAmountOfDrawInstances();
			raw_arrays_data_ptr				 = &m_raw_array_instanced_data;
			raw_arrays_data_size_ptr		 = &m_raw_array_instanced_data_size;
			unordered_arrays_data_ptr		 = &m_unordered_array_instanced_data;
			unordered_arrays_data_size_ptr   = &m_unordered_array_instanced_data_size;
			unordered_elements_data_ptr		 = &m_unordered_elements_instanced_data;
			unordered_elements_data_size_ptr = &m_unordered_elements_instanced_data_size;
		}

		getRenderTargetSize(n_instances, &rendertarget_width, &rendertarget_height);

		/* Store full-screen quad coordinates that will be used for actual array data generation. */
		float dx = 2.0f / float(rendertarget_width);
		float dy = 2.0f / float(rendertarget_height);

		/* Generate raw vertex array data */
		unsigned int single_rt_height = 0;
		unsigned int single_rt_width  = 0;
		unsigned int whole_rt_width   = 0;
		unsigned int whole_rt_height  = 0;

		*raw_arrays_data_size_ptr =
			static_cast<unsigned int>(getAmountOfVerticesPerInstance() * 4 /* components */ * sizeof(float));
		*raw_arrays_data_ptr = new float[*raw_arrays_data_size_ptr / sizeof(float)];

		getRenderTargetSize(1, &single_rt_width, &single_rt_height);
		getRenderTargetSize(getAmountOfDrawInstances(), &whole_rt_width, &whole_rt_height);

		/* Generate the general coordinates storage first.
		 *
		 * For non-instanced draw calls, we only need to draw a single instance, hence we are free
		 * to use screen-space coordinates.
		 * For instanced draw calls, we'll have the vertex shader add gl_InstanceID-specific deltas
		 * to make sure the vertices are laid out correctly, so map <-1, 1> range to <0, screen_space_height_of_single_instance>
		 */
		std::vector<tcu::Vec4> data_coordinates;
		float				   dx_multiplier = 0.0f;
		float				   dy_multiplier = 0.0f;
		float				   end_y		 = 0.0f;
		float				   mid_y		 = 0.0f;
		float				   start_y		 = 0.0f;

		if (is_instanced)
		{
			start_y = -1.0f;
			end_y   = start_y + float(single_rt_height) / float(whole_rt_height) * 2.0f;
			mid_y   = start_y + (end_y - start_y) * 0.5f;
		}
		else
		{
			end_y   = 1.0f;
			mid_y   = 0.0f;
			start_y = -1.0f;
		}

		if (output_type == SHADER_OUTPUT_TYPE_POINTS)
		{
			dx_multiplier = 1.5f;
			dy_multiplier = 1.5f;
		}
		else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP)
		{
			dx_multiplier = 1.5f;
			dy_multiplier = 1.5f;
		}

		/* W stores information whether given vertex is the middle vertex */
		data_coordinates.push_back(tcu::Vec4(0, mid_y, 0, 1));						  /* Middle vertex */
		data_coordinates.push_back(tcu::Vec4(-1 + dx * dx_multiplier, mid_y, 0, 0));  /* Left vertex */
		data_coordinates.push_back(tcu::Vec4(0, start_y + dy * dy_multiplier, 0, 0)); /* Top vertex */
		data_coordinates.push_back(tcu::Vec4(1 - dx * dx_multiplier, mid_y, 0, 0));   /* Right vertex */
		data_coordinates.push_back(tcu::Vec4(0, end_y - dy * dy_multiplier, 0, 0));   /* Bottom vertex */

		/* Now that we have the general storage ready, we can generate raw array data for specific draw
		 * call that this specific test instance will be verifying */
		int	n_raw_array_indices	 = 0;
		int	raw_array_indices[24]   = { -1 }; /* 12 is a max for all supported input geometry */
		float* raw_array_traveller_ptr = *raw_arrays_data_ptr;

		for (unsigned int n = 0; n < sizeof(raw_array_indices) / sizeof(raw_array_indices[0]); ++n)
		{
			raw_array_indices[n] = -1;
		}

		switch (m_drawcall_mode)
		{
		case GL_TRIANGLES:
		{
			/* ABC triangle */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 1;
			raw_array_indices[2] = 2;

			/* ACD triangle */
			raw_array_indices[3] = 0;
			raw_array_indices[4] = 2;
			raw_array_indices[5] = 3;

			/* ADE triangle */
			raw_array_indices[6] = 0;
			raw_array_indices[7] = 3;
			raw_array_indices[8] = 4;

			/* AEB triangle */
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 4;
			raw_array_indices[11] = 1;

			n_raw_array_indices = 12;

			break;
		} /* case GL_TRIANGLES: */

		case GL_TRIANGLES_ADJACENCY_EXT:
		{
			/* Note: Geometry shader used by this test does not rely on adjacency data
			 *       so we will fill corresponding indices with meaningless information
			 *       (always first vertex data) */
			/* ABC triangle */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 0;
			raw_array_indices[2] = 1;
			raw_array_indices[3] = 0;
			raw_array_indices[4] = 2;
			raw_array_indices[5] = 0;

			/* ACD triangle */
			raw_array_indices[6]  = 0;
			raw_array_indices[7]  = 0;
			raw_array_indices[8]  = 2;
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 3;
			raw_array_indices[11] = 0;

			/* ADE triangle */
			raw_array_indices[12] = 0;
			raw_array_indices[13] = 0;
			raw_array_indices[14] = 3;
			raw_array_indices[15] = 0;
			raw_array_indices[16] = 4;
			raw_array_indices[17] = 0;

			/* AEB triangle */
			raw_array_indices[18] = 0;
			raw_array_indices[19] = 0;
			raw_array_indices[20] = 4;
			raw_array_indices[21] = 0;
			raw_array_indices[22] = 1;
			raw_array_indices[23] = 0;

			n_raw_array_indices = 24;

			break;
		} /* case GL_TRIANGLES_ADJACENCY_EXT:*/

		case GL_TRIANGLE_FAN:
		{
			/* ABCDEB */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 1;
			raw_array_indices[2] = 2;
			raw_array_indices[3] = 3;
			raw_array_indices[4] = 4;
			raw_array_indices[5] = 1;

			n_raw_array_indices = 6;

			break;
		} /* case GL_TRIANGLE_FAN: */

		case GL_TRIANGLE_STRIP:
		{
			/* BACDAEB.
			 *
			 * Note that this will generate a degenerate triangle (ACD & CDA) but that's fine
			 * since we only sample triangle centroids in this test.
			 */
			raw_array_indices[0] = 1;
			raw_array_indices[1] = 0;
			raw_array_indices[2] = 2;
			raw_array_indices[3] = 3;
			raw_array_indices[4] = 0;
			raw_array_indices[5] = 4;
			raw_array_indices[6] = 1;

			n_raw_array_indices = 7;

			break;
		} /* case GL_TRIANGLE_STRIP: */

		case GL_TRIANGLE_STRIP_ADJACENCY_EXT:
		{
			/* Order as in GL_TRIANGLE_STRIP case. Adjacency data not needed for the test,
			 * hence any data can be used.
			 */
			raw_array_indices[0]  = 1;
			raw_array_indices[1]  = 0;
			raw_array_indices[2]  = 0;
			raw_array_indices[3]  = 0;
			raw_array_indices[4]  = 2;
			raw_array_indices[5]  = 0;
			raw_array_indices[6]  = 3;
			raw_array_indices[7]  = 0;
			raw_array_indices[8]  = 0;
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 4;
			raw_array_indices[11] = 0;
			raw_array_indices[12] = 1;
			raw_array_indices[13] = 0;

			n_raw_array_indices = 14;
			break;
		} /* case GL_TRIANGLE_STRIP_ADJACENCY_EXT: */

		default:
		{
			TCU_FAIL("Unsupported draw call mode");
		}
		} /* switch (m_drawcall_mode) */

		for (int index = 0; index < n_raw_array_indices; ++index)
		{
			if (raw_array_indices[index] != -1)
			{
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].x();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].y();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].z();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].w();
				raw_array_traveller_ptr++;
			}
		}

		/* Generate unordered data:
		 *
		 * Store vertices in reversed order and configure indices so that the pipeline receives
		 * vertex data in original order */
		*unordered_arrays_data_size_ptr   = *raw_arrays_data_size_ptr;
		*unordered_arrays_data_ptr		  = new float[*unordered_arrays_data_size_ptr];
		*unordered_elements_data_size_ptr = static_cast<unsigned int>(n_raw_array_indices * sizeof(unsigned char));
		*unordered_elements_data_ptr	  = new unsigned char[*unordered_elements_data_size_ptr];

		/* Set unordered array data first */
		for (int index = 0; index < n_raw_array_indices; ++index)
		{
			memcpy(*unordered_arrays_data_ptr + 4 /* components */ * (n_raw_array_indices - 1 - index),
				   *raw_arrays_data_ptr + 4 /* components */ * index, sizeof(float) * 4 /* components */);
		}

		/* Followed by index data */
		for (int n = 0; n < n_raw_array_indices; ++n)
		{
			(*unordered_elements_data_ptr)[n] = (unsigned char)(n_raw_array_indices - 1 - n);
		}
	} /* for (both cases) */
}